

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_ConstructEmpty_Test::~SingleArena_ConstructEmpty_Test
          (SingleArena_ConstructEmpty_Test *this)

{
  ~SingleArena_ConstructEmpty_Test
            ((SingleArena_ConstructEmpty_Test *)
             &this[-1].super_SingleArena.super_TestWithParam<bool>.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(SingleArena, ConstructEmpty) {
  auto arena = GetArena();
  ArenaStringPtr field(arena.get());

  EXPECT_EQ(field.Get(), "");
  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_FALSE(field.IsDefault());
  } else {
    EXPECT_TRUE(field.IsDefault());
  }
  if (arena == nullptr) field.Destroy();
}